

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Loop.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::LoopConstraint::calcPositionError
          (LoopConstraint *this,Model *model,double time,VectorNd *Q,VectorNd *errSysUpd,
          ConstraintCache *cache,bool updateKinematics)

{
  double dVar1;
  bool bVar2;
  reference pvVar3;
  TransposeReturnType TVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDX;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *in_RSI;
  long in_RDI;
  double dVar8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  PVar9;
  uint i;
  DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
  *in_stack_fffffffffffffd88;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_00;
  undefined4 in_stack_fffffffffffffda0;
  value_type vVar10;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_01;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *this_02;
  undefined4 in_stack_fffffffffffffdc8;
  value_type vVar11;
  undefined8 in_stack_fffffffffffffe08;
  Scalar SVar12;
  VectorNd *in_stack_fffffffffffffe10;
  Model *in_stack_fffffffffffffe18;
  reference local_1d0;
  uint local_1bc;
  non_const_type local_168;
  non_const_type local_140;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_138;
  non_const_type local_e0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_d8;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 uVar13;
  undefined1 in_stack_ffffffffffffffa0 [16];
  VectorNd *in_stack_ffffffffffffffb0;
  Model *in_stack_ffffffffffffffb8;
  
  uVar13 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  this_00 = in_RSI;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  vVar10 = *pvVar3;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  CalcBodyToBaseCoordinates
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._12_4_,
             in_stack_ffffffffffffffa0._0_8_,(bool)uVar13);
  Vector3_t::operator=((Vector3_t *)this_00,(Vector3_t *)in_stack_fffffffffffffd88);
  this_01 = in_RSI;
  other = in_RDX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
  TVar4 = Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                    ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd88);
  uVar13 = (undefined1)((ulong)TVar4.m_matrix >> 0x38);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  PVar9 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                    (this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                             in_stack_fffffffffffffd88);
  Matrix3_t::operator=
            ((Matrix3_t *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffffd88);
  this_02 = in_RSI;
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),1);
  vVar11 = *pvVar3;
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),1);
  CalcBodyToBaseCoordinates
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,PVar9.m_rhs._4_4_,
             (Vector3d *)PVar9.m_lhs.m_matrix.m_matrix,(bool)uVar13);
  Vector3_t::operator=((Vector3_t *)this_00,(Vector3_t *)in_stack_fffffffffffffd88);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),1);
  CalcBodyWorldOrientation
            (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             (uint)((ulong)in_stack_fffffffffffffe08 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
  local_e0 = (non_const_type)
             Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                        in_stack_fffffffffffffd88);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),1);
  local_d8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                       (this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                in_stack_fffffffffffffd88);
  Matrix3_t::operator=
            ((Matrix3_t *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffffd88);
  local_140 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffffd88);
  local_138 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
                        (this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                                 in_stack_fffffffffffffd88);
  Matrix3_t::operator=
            ((Matrix3_t *)this_00,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)in_stack_fffffffffffffd88);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x802932);
  dVar8 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x80295a);
  dVar1 = *pSVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88);
  *pSVar6 = (dVar8 - dVar1) * -0.5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x8029b5);
  dVar8 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x8029dc);
  dVar1 = *pSVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88);
  *pSVar6 = (dVar8 - dVar1) * -0.5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x802a38);
  SVar12 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88,0x802a62);
  dVar8 = (SVar12 - *pSVar5) * -0.5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)this_00,
                      (Index)in_stack_fffffffffffffd88);
  *pSVar6 = dVar8;
  local_168 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                         in_stack_fffffffffffffd88);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this_02,other);
  Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
            (this_01,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)CONCAT44(vVar10,in_stack_fffffffffffffda0));
  Eigen::DenseBase<Eigen::Matrix<double,6,1,0,6,1>>::block<int,int>
            ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_RSI,
             CONCAT44(vVar11,in_stack_fffffffffffffdc8),(Index)in_RDX,(int)((ulong)this_02 >> 0x20),
             (int)this_02);
  Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,-1,false>::operator=
            ((Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false> *)this_00,
             in_stack_fffffffffffffd88);
  for (local_1bc = 0; local_1bc < *(uint *)(in_RDI + 0x30); local_1bc = local_1bc + 1) {
    local_1d0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)other,(size_type)this_01);
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_1d0);
    if (bVar2) {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (in_RDI + 0xd8),(ulong)local_1bc);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd88);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,1,0,6,1>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_> *)this_00,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd88 =
           (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
            *)Eigen::internal::dense_product_base::operator_cast_to_double
                        ((dense_product_base<Eigen::Transpose<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_6>
                          *)in_RDX);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (Index)in_stack_fffffffffffffd88);
      *pSVar7 = (Scalar)in_stack_fffffffffffffd88;
    }
    else {
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          (Index)in_stack_fffffffffffffd88);
      *pSVar7 = 0.0;
    }
  }
  return;
}

Assistant:

void LoopConstraint::calcPositionError(Model &model,
                                      const double time,
                                      const Math::VectorNd &Q,
                                      Math::VectorNd &errSysUpd,
                                      ConstraintCache &cache,
                                      bool updateKinematics)
{

  // Constraints computed in the predecessor body frame.


  // Compute the position of the two contact points.

  //Kp: predecessor frame
  cache.stA.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[0],bodyFrames[0].r,
                                          updateKinematics);
  cache.stA.E = CalcBodyWorldOrientation(model,Q,bodyIds[0],updateKinematics
                                         ).transpose()*bodyFrames[0].E;

  //Ks: successor frame
  cache.stB.r = CalcBodyToBaseCoordinates(model,Q,bodyIds[1],bodyFrames[1].r,
                                          updateKinematics);
  cache.stB.E = CalcBodyWorldOrientation(model,Q,bodyIds[1],updateKinematics
                                         ).transpose()*bodyFrames[1].E;


  // Compute the orientation from the predecessor to the successor frame.

  cache.mat3A = cache.stA.E.transpose()*cache.stB.E;

  // The first three elements represent the rotation error.
  // This formulation is equivalent to u * sin(theta), where u and theta are
  // the angle-axis of rotation from the predecessor to the successor frame.
  // These quantities are expressed in the predecessor frame. This is also
  // similar to the rotation error calculation that appears in Table 8.1 of
  // Featherstone.
  cache.svecA[0] = -0.5*(cache.mat3A(1,2)-cache.mat3A(2,1));
  cache.svecA[1] = -0.5*(cache.mat3A(2,0)-cache.mat3A(0,2));
  cache.svecA[2] = -0.5*(cache.mat3A(0,1)-cache.mat3A(1,0));

  // The last three elements represent the position error.
  // It is equivalent to the difference in the position of the two
  // constraint points. The distance is projected on the predecessor frame
  // to be consistent with the rotation.

  //Qn: Should this be multiplied by -0.5 to be consistent with table 8.1?
  //For now I'm leaving this as is: this is equivalent to the functioning
  //original loop constraint code.
  cache.svecA.block(3,0,3,1)=cache.stA.E.transpose()*(cache.stB.r-cache.stA.r);

  for(unsigned int i=0; i<sizeOfConstraint;++i){
    if(positionConstraint[i]){
      errSysUpd[rowInSystem+i] = T[i].transpose()*cache.svecA;
    }else{
      errSysUpd[rowInSystem+i] = 0.;
    }
  }

}